

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalEndWriteTransaction(Wal *pWal)

{
  int in_EAX;
  int extraout_EAX;
  
  if (pWal->writeLock != '\0') {
    walUnlockExclusive(pWal,0,1);
    pWal->writeLock = '\0';
    pWal->iReCksum = 0;
    pWal->truncateOnCommit = '\0';
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalEndWriteTransaction(Wal *pWal){
  if( pWal->writeLock ){
    walUnlockExclusive(pWal, WAL_WRITE_LOCK, 1);
    pWal->writeLock = 0;
    pWal->iReCksum = 0;
    pWal->truncateOnCommit = 0;
  }
  return SQLITE_OK;
}